

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O2

char * read_string(char **memory,size_t *length)

{
  long in_RAX;
  char *__ptr;
  int *piVar1;
  ulong uVar2;
  char *__src;
  ulong __n;
  long lStack_38;
  int16_t string_length;
  
  lStack_38 = in_RAX;
  if (1 < *length) {
    lStack_38 = CONCAT26(*(undefined2 *)*memory,(int6)in_RAX);
    __src = *memory + 2;
    be2ne(&string_length,2);
    *memory = __src;
    uVar2 = *length - 2;
    *length = uVar2;
    if ((ushort)string_length <= uVar2 && -1 < lStack_38) {
      __n = (ulong)string_length;
      __ptr = (char *)malloc(__n + 1);
      if (__ptr != (char *)0x0) {
        if (__n <= uVar2) {
          memcpy(__ptr,__src,__n);
          *memory = __src + __n;
          *length = uVar2 - __n;
          __ptr[__n] = '\0';
          return __ptr;
        }
        goto LAB_0010338d;
      }
      piVar1 = __errno_location();
      *piVar1 = -2;
    }
  }
  __ptr = (char *)0x0;
LAB_0010338d:
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    *piVar1 = -1;
  }
  free(__ptr);
  return (char *)0x0;
}

Assistant:

static char* read_string(const char** memory, size_t* length)
{
    int16_t string_length;
    char* ret = NULL;

    READ_GENERIC(&string_length, sizeof string_length, swapped_memscan, goto parse_error);

    if(string_length < 0)               goto parse_error;
    if(*length < (size_t)string_length) goto parse_error;

    CHECKED_MALLOC(ret, string_length + 1, goto parse_error);

    READ_GENERIC(ret, (size_t)string_length, memscan, goto parse_error);

    ret[string_length] = '\0'; /* don't forget to NULL-terminate ;) */
    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(ret);
    return NULL;
}